

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O3

void __thiscall xemmai::t_emit::f_at(t_emit *this,t_node *a_node)

{
  pointer *pptVar1;
  t_code *ptVar2;
  iterator __position;
  t_at_address local_28;
  
  ptVar2 = this->v_code;
  local_28.super_t_at.v_column = (a_node->v_at).v_column;
  local_28.super_t_at.v_position = (a_node->v_at).v_position;
  local_28.super_t_at.v_line = (a_node->v_at).v_line;
  local_28.v_address =
       (long)(ptVar2->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(ptVar2->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  __position._M_current =
       (ptVar2->v_ats).
       super__Vector_base<xemmai::t_code::t_at_address,_std::allocator<xemmai::t_code::t_at_address>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (ptVar2->v_ats).
      super__Vector_base<xemmai::t_code::t_at_address,_std::allocator<xemmai::t_code::t_at_address>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<xemmai::t_code::t_at_address,_std::allocator<xemmai::t_code::t_at_address>_>::
    _M_realloc_insert<xemmai::t_code::t_at_address>(&ptVar2->v_ats,__position,&local_28);
  }
  else {
    ((__position._M_current)->super_t_at).v_column = local_28.super_t_at.v_column;
    (__position._M_current)->v_address = local_28.v_address;
    ((__position._M_current)->super_t_at).v_position = local_28.super_t_at.v_position;
    ((__position._M_current)->super_t_at).v_line = local_28.super_t_at.v_line;
    pptVar1 = &(ptVar2->v_ats).
               super__Vector_base<xemmai::t_code::t_at_address,_std::allocator<xemmai::t_code::t_at_address>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pptVar1 = *pptVar1 + 1;
  }
  return;
}

Assistant:

void f_at(ast::t_node* a_node)
	{
		v_code->v_ats.push_back({a_node->v_at, f_last()});
	}